

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filteredbrk.cpp
# Opt level: O0

void __thiscall
icu_63::SimpleFilteredSentenceBreakIterator::SimpleFilteredSentenceBreakIterator
          (SimpleFilteredSentenceBreakIterator *this,SimpleFilteredSentenceBreakIterator *other)

{
  int iVar1;
  SimpleFilteredSentenceBreakData *pSVar2;
  BreakIterator *pBVar3;
  undefined4 extraout_var;
  SimpleFilteredSentenceBreakIterator *other_local;
  SimpleFilteredSentenceBreakIterator *this_local;
  
  BreakIterator::BreakIterator(&this->super_BreakIterator,&other->super_BreakIterator);
  (this->super_BreakIterator).super_UObject._vptr_UObject =
       (_func_int **)&PTR__SimpleFilteredSentenceBreakIterator_004a19b0;
  pSVar2 = SimpleFilteredSentenceBreakData::incr(other->fData);
  this->fData = pSVar2;
  pBVar3 = LocalPointerBase<icu_63::BreakIterator>::operator->
                     (&(other->fDelegate).super_LocalPointerBase<icu_63::BreakIterator>);
  iVar1 = (*(pBVar3->super_UObject)._vptr_UObject[4])();
  LocalPointer<icu_63::BreakIterator>::LocalPointer
            (&this->fDelegate,(BreakIterator *)CONCAT44(extraout_var,iVar1));
  LocalUTextPointer::LocalUTextPointer(&this->fText,(UText *)0x0);
  return;
}

Assistant:

SimpleFilteredSentenceBreakIterator::SimpleFilteredSentenceBreakIterator(const SimpleFilteredSentenceBreakIterator& other)
  : BreakIterator(other), fData(other.fData->incr()), fDelegate(other.fDelegate->clone())
{
}